

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

int Lodtalk::SmallInteger::stAdd(InterpreterProxy *interpreter)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SmallIntegerValue SVar3;
  SmallIntegerValue SVar4;
  SmallIntegerValue ib;
  SmallIntegerValue ia;
  Oop b;
  Oop a;
  InterpreterProxy *interpreter_local;
  
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) == 1) {
    b.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])();
    b.field_0.uintValue._4_4_ = extraout_var_00;
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    ia = CONCAT44(extraout_var_01,iVar2);
    bVar1 = Oop::isSmallInteger(&b);
    if ((bVar1) && (bVar1 = Oop::isSmallInteger((Oop *)&ia), bVar1)) {
      SVar3 = Oop::decodeSmallInteger(&b);
      SVar4 = Oop::decodeSmallInteger((Oop *)&ia);
      interpreter_local._4_4_ =
           (*interpreter->_vptr_InterpreterProxy[0x16])(interpreter,SVar3 + SVar4);
    }
    else {
      interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
    }
  }
  else {
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
  }
  return interpreter_local._4_4_;
}

Assistant:

int SmallInteger::stAdd(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    auto a = interpreter->getReceiver();
    auto b = interpreter->getTemporary(0);
    if (!a.isSmallInteger() || !b.isSmallInteger())
        return interpreter->primitiveFailed();

    auto ia = a.decodeSmallInteger();
    auto ib = b.decodeSmallInteger();
    return interpreter->returnInteger(ia + ib);
}